

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockExpectedCall_getParameterValueOfObjectType_TestShell::createTest
          (TEST_MockExpectedCall_getParameterValueOfObjectType_TestShell *this)

{
  TEST_MockExpectedCall_getParameterValueOfObjectType_Test *this_00;
  TEST_MockExpectedCall_getParameterValueOfObjectType_TestShell *this_local;
  
  this_00 = (TEST_MockExpectedCall_getParameterValueOfObjectType_Test *)
            operator_new(0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                         ,0x185);
  TEST_MockExpectedCall_getParameterValueOfObjectType_Test::
  TEST_MockExpectedCall_getParameterValueOfObjectType_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockExpectedCall, getParameterValueOfObjectType)
{
    TypeForTestingExpectedFunctionCallComparator comparator;
    MockNamedValueComparatorsAndCopiersRepository repository;
    MockNamedValue::setDefaultComparatorsAndCopiersRepository(&repository);
    repository.installComparator("type", comparator);

    TypeForTestingExpectedFunctionCall type(1);
    call->withParameterOfType("type", "name", &type);
    POINTERS_EQUAL(&type, call->getInputParameter("name").getConstObjectPointer());
    STRCMP_EQUAL("1", call->getInputParameterValueString("name").asCharString());
}